

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

void set_occupation(_func_int *fn,char *txt,int xtime)

{
  occupation = fn;
  if (xtime != 0) {
    occupation = timed_occupation;
    timed_occ_fn = fn;
  }
  occtxt = txt;
  occtime = 0;
  return;
}

Assistant:

void set_occupation(int (*fn)(void), const char *txt, int xtime)
{
	if (xtime) {
		occupation = timed_occupation;
		timed_occ_fn = fn;
	} else
		occupation = fn;
	occtxt = txt;
	occtime = 0;
	return;
}